

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStructTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_7::setUniform
               (Functions *gl,deUint32 programID,char *name,int value)

{
  GLenum err;
  char *msg;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  GLint local_28;
  GLint local_24;
  int loc;
  int value_local;
  char *name_local;
  Functions *pFStack_10;
  deUint32 programID_local;
  Functions *gl_local;
  
  local_24 = value;
  _loc = name;
  name_local._4_4_ = programID;
  pFStack_10 = gl;
  local_28 = (*gl->getUniformLocation)(programID,name);
  (*pFStack_10->uniform1i)(local_28,local_24);
  err = (*pFStack_10->getError)();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"Failed to set ",&local_69)
  ;
  std::operator+(&local_48,&local_68,_loc);
  msg = (char *)std::__cxx11::string::c_str();
  glu::checkError(err,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderStructTests.cpp"
                  ,0x49a);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

void setUniform (const glw::Functions& gl, deUint32 programID, const char* name, int value)
{
	int loc = gl.getUniformLocation(programID, name);
	gl.uniform1i(loc, value);
	CHECK_SET_UNIFORM(name);
}